

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestIncrement(void)

{
  return true;
}

Assistant:

bool TestIncrement()
{
    TEST_CHECK(TestIncrementF<Counter64>());
    TEST_CHECK(TestIncrementF<Counter48>());
    TEST_CHECK(TestIncrementF<Counter32>());
    TEST_CHECK(TestIncrementF<Counter24>());
    TEST_CHECK(TestIncrementF<Counter16>());
    TEST_CHECK(TestIncrementF<Counter10>());
    TEST_CHECK(TestIncrementF<Counter8>());
    TEST_CHECK(TestIncrementF<Counter4>());
    return true;
}